

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QSharedDataPointer<QNetworkInterfacePrivate>>::
emplace<QSharedDataPointer<QNetworkInterfacePrivate>>
          (QMovableArrayOps<QSharedDataPointer<QNetworkInterfacePrivate>_> *this,qsizetype i,
          QSharedDataPointer<QNetworkInterfacePrivate> *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  QSharedDataPointer<QNetworkInterfacePrivate> *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QSharedDataPointer<QNetworkInterfacePrivate> tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar6;
  Inserter *this_00;
  Inserter local_38;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::needsDetach
                    ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::end
                ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)in_RDI);
      QSharedDataPointer<QNetworkInterfacePrivate>::QSharedDataPointer
                ((QSharedDataPointer<QNetworkInterfacePrivate> *)in_RDI,
                 (QSharedDataPointer<QNetworkInterfacePrivate> *)
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      in_RDI->displaceTo =
           (QSharedDataPointer<QNetworkInterfacePrivate> *)((long)&(in_RDI->displaceTo->d).ptr + 1);
      goto LAB_0024662a;
    }
    if ((in_RSI == (QSharedDataPointer<QNetworkInterfacePrivate> *)0x0) &&
       (qVar3 = QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::begin
                ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)0x246504);
      QSharedDataPointer<QNetworkInterfacePrivate>::QSharedDataPointer
                ((QSharedDataPointer<QNetworkInterfacePrivate> *)in_RDI,
                 (QSharedDataPointer<QNetworkInterfacePrivate> *)
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo =
           (QSharedDataPointer<QNetworkInterfacePrivate> *)((long)&(in_RDI->displaceTo->d).ptr + 1);
      goto LAB_0024662a;
    }
  }
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QSharedDataPointer<QNetworkInterfacePrivate>::QSharedDataPointer
            ((QSharedDataPointer<QNetworkInterfacePrivate> *)in_RDI,
             (QSharedDataPointer<QNetworkInterfacePrivate> *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar4 = in_RDI->displaceTo != (QSharedDataPointer<QNetworkInterfacePrivate> *)0x0;
  uVar5 = bVar4 && in_RSI == (QSharedDataPointer<QNetworkInterfacePrivate> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QSharedDataPointer<QNetworkInterfacePrivate> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::detachAndGrow
            ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QSharedDataPointer<QNetworkInterfacePrivate> **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
             (QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    QMovableArrayOps<QSharedDataPointer<QNetworkInterfacePrivate>_>::Inserter::Inserter
              (in_RDX,(QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)
                      CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
               (qsizetype)in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff98));
    QMovableArrayOps<QSharedDataPointer<QNetworkInterfacePrivate>_>::Inserter::insertOne
              (in_RDI,(QSharedDataPointer<QNetworkInterfacePrivate> *)
                      CONCAT17(uVar5,in_stack_ffffffffffffff98));
    QMovableArrayOps<QSharedDataPointer<QNetworkInterfacePrivate>_>::Inserter::~Inserter(&local_38);
  }
  else {
    QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::begin
              ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)0x2465be);
    QSharedDataPointer<QNetworkInterfacePrivate>::QSharedDataPointer
              ((QSharedDataPointer<QNetworkInterfacePrivate> *)in_RDI,
               (QSharedDataPointer<QNetworkInterfacePrivate> *)
               CONCAT17(uVar5,in_stack_ffffffffffffff98));
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo =
         (QSharedDataPointer<QNetworkInterfacePrivate> *)((long)&(in_RDI->displaceTo->d).ptr + 1);
  }
  QSharedDataPointer<QNetworkInterfacePrivate>::~QSharedDataPointer
            ((QSharedDataPointer<QNetworkInterfacePrivate> *)in_RDI);
LAB_0024662a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }